

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O0

void __thiscall icu_63::RBBITableBuilder::removeState(RBBITableBuilder *this,IntPair duplStates)

{
  int32_t iVar1;
  int32_t iVar2;
  RBBIStateDescriptor *this_00;
  void *pvVar3;
  uint local_4c;
  int32_t newVal;
  int32_t existingVal;
  int32_t col;
  RBBIStateDescriptor *sd;
  int32_t state;
  int32_t numCols;
  int32_t numStates;
  RBBIStateDescriptor *duplSD;
  int32_t duplState;
  int32_t keepState;
  RBBITableBuilder *this_local;
  IntPair duplStates_local;
  
  this_local._0_4_ = duplStates.first;
  this_local._4_4_ = duplStates.second;
  this_00 = (RBBIStateDescriptor *)UVector::elementAt(this->fDStates,this_local._4_4_);
  pvVar3 = (void *)(ulong)this_local._4_4_;
  UVector::removeElementAt(this->fDStates,this_local._4_4_);
  if (this_00 != (RBBIStateDescriptor *)0x0) {
    RBBIStateDescriptor::~RBBIStateDescriptor(this_00);
    UMemory::operator_delete((UMemory *)this_00,pvVar3);
  }
  iVar1 = UVector::size(this->fDStates);
  iVar2 = RBBISetBuilder::getNumCharCategories(this->fRB->fSetBuilder);
  for (sd._4_4_ = 0; sd._4_4_ < iVar1; sd._4_4_ = sd._4_4_ + 1) {
    pvVar3 = UVector::elementAt(this->fDStates,sd._4_4_);
    for (newVal = 0; newVal < iVar2; newVal = newVal + 1) {
      local_4c = UVector32::elementAti(*(UVector32 **)((long)pvVar3 + 0x28),newVal);
      if (local_4c == this_local._4_4_) {
        local_4c = (uint)this_local;
      }
      else if ((int)this_local._4_4_ < (int)local_4c) {
        local_4c = local_4c - 1;
      }
      UVector32::setElementAt(*(UVector32 **)((long)pvVar3 + 0x28),local_4c,newVal);
    }
    if (*(uint *)((long)pvVar3 + 4) == this_local._4_4_) {
      *(uint *)((long)pvVar3 + 4) = (uint)this_local;
    }
    else if ((int)this_local._4_4_ < *(int *)((long)pvVar3 + 4)) {
      *(int *)((long)pvVar3 + 4) = *(int *)((long)pvVar3 + 4) + -1;
    }
    if (*(uint *)((long)pvVar3 + 8) == this_local._4_4_) {
      *(uint *)((long)pvVar3 + 8) = (uint)this_local;
    }
    else if ((int)this_local._4_4_ < *(int *)((long)pvVar3 + 8)) {
      *(int *)((long)pvVar3 + 8) = *(int *)((long)pvVar3 + 8) + -1;
    }
  }
  return;
}

Assistant:

void RBBITableBuilder::removeState(IntPair duplStates) {
    const int32_t keepState = duplStates.first;
    const int32_t duplState = duplStates.second;
    U_ASSERT(keepState < duplState);
    U_ASSERT(duplState < fDStates->size());

    RBBIStateDescriptor *duplSD = (RBBIStateDescriptor *)fDStates->elementAt(duplState);
    fDStates->removeElementAt(duplState);
    delete duplSD;

    int32_t numStates = fDStates->size();
    int32_t numCols = fRB->fSetBuilder->getNumCharCategories();
    for (int32_t state=0; state<numStates; ++state) {
        RBBIStateDescriptor *sd = (RBBIStateDescriptor *)fDStates->elementAt(state);
        for (int32_t col=0; col<numCols; col++) {
            int32_t existingVal = sd->fDtran->elementAti(col);
            int32_t newVal = existingVal;
            if (existingVal == duplState) {
                newVal = keepState;
            } else if (existingVal > duplState) {
                newVal = existingVal - 1;
            }
            sd->fDtran->setElementAt(newVal, col);
        }
        if (sd->fAccepting == duplState) {
            sd->fAccepting = keepState;
        } else if (sd->fAccepting > duplState) {
            sd->fAccepting--;
        }
        if (sd->fLookAhead == duplState) {
            sd->fLookAhead = keepState;
        } else if (sd->fLookAhead > duplState) {
            sd->fLookAhead--;
        }
    }
}